

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

size_t __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateOffsets
          (MessageGenerator *this,Printer *p)

{
  Descriptor *desc;
  undefined8 uVar1;
  FieldRangeImpl<google::protobuf::Descriptor> *pFVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_type sVar7;
  FieldOptions *this_00;
  OneofDescriptor *pOVar8;
  char *pcVar9;
  LogMessage *pLVar10;
  reference pvVar11;
  reference piVar12;
  AlphaNum *b;
  FieldDescriptor *field_00;
  AlphaNum *a;
  Iterator IVar13;
  Iterator IVar14;
  string_view sVar15;
  bool local_481;
  allocator<char> local_451;
  AlphaNum local_450;
  AlphaNum local_420;
  undefined1 local_3f0 [8];
  string index_1;
  iterator iStack_3c8;
  int inlined_string_index;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  AlphaNum local_3a8;
  undefined1 local_378 [8];
  string index;
  size_t i;
  Voidify local_339;
  Nullable<const_char_*> local_338;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  char *local_328;
  value_type local_320;
  value_type oneof;
  Iterator __end3_1;
  Iterator __begin3_1;
  OneOfRangeImpl *__range3_1;
  undefined1 local_2e0 [4];
  int count;
  byte local_2a9;
  string local_2a8;
  AlphaNum local_288;
  string local_258;
  char *local_238;
  value_type_conflict local_230;
  value_type_conflict field;
  Iterator __end3;
  Iterator __begin3;
  FieldRangeImpl<google::protobuf::Descriptor> *__range3;
  size_t entries;
  FieldRangeImpl<google::protobuf::Descriptor> *local_1e8;
  size_t offsets;
  byte local_1be;
  byte local_1bd;
  byte local_1bc;
  byte local_1bb;
  byte local_1ba;
  bool local_1b9;
  bool has_split;
  bool has_inline_strings;
  bool has_weak_fields;
  bool has_oneofs;
  bool has_extensions;
  undefined1 *puStack_1b8;
  bool has_has_bits;
  anon_class_8_1_1175d99e make_bitmap;
  undefined1 local_1a8 [4];
  int num_generated_indices;
  Formatter format;
  Span<const_google::protobuf::io::Printer::Sub> local_168;
  undefined1 local_158 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  t;
  Options local_130;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  local_58;
  Span<const_google::protobuf::io::Printer::Sub> local_40;
  undefined1 local_30 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v;
  Printer *p_local;
  MessageGenerator *this_local;
  
  desc = this->descriptor_;
  v.storage_.callback_buffer_._8_8_ = p;
  cpp::Options::Options(&local_130,&this->options_);
  cpp::anon_unknown_0::ClassVars(&local_58,desc,&local_130);
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
            ((Span<google::protobuf::io::Printer::Sub_const> *)&local_40,&local_58);
  io::Printer::WithVars
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_30,p,local_40);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector(&local_58);
  cpp::Options::~Options(&local_130);
  uVar1 = v.storage_.callback_buffer_._8_8_;
  MakeTrackerCalls((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                    *)((long)&format.vars_.
                              super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              .
                              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              .settings_.
                              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                              .
                              super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                      + 0x18),this->descriptor_,&this->options_);
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
            ((Span<google::protobuf::io::Printer::Sub_const> *)&local_168,
             (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
              *)((long)&format.vars_.
                        super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .settings_.
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                + 0x18));
  io::Printer::WithVars
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_158,(Printer *)uVar1,local_168);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)((long)&format.vars_.
                     super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     .
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     .settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
             + 0x18));
  Formatter::Formatter((Formatter *)local_1a8,(Printer *)v.storage_.callback_buffer_._8_8_);
  make_bitmap.num_generated_indices._4_4_ = 1;
  puStack_1b8 = (undefined1 *)((long)&make_bitmap.num_generated_indices + 4);
  bVar3 = std::vector<int,_std::allocator<int>_>::empty(&this->has_bit_indices_);
  local_481 = true;
  if (bVar3) {
    local_481 = IsMapEntryMessage(this->descriptor_);
  }
  local_1b9 = local_481;
  iVar4 = Descriptor::extension_range_count(this->descriptor_);
  local_1ba = 0 < iVar4;
  iVar4 = Descriptor::real_oneof_decl_count(this->descriptor_);
  local_1bb = 0 < iVar4;
  local_1bc = 0 < this->num_weak_fields_;
  bVar3 = std::vector<int,_std::allocator<int>_>::empty(&this->inlined_string_indices_);
  local_1bd = !bVar3;
  local_1be = ShouldSplit(this->descriptor_,&this->options_);
  GenerateOffsets(google::protobuf::io::Printer*)::$_0::operator()
            ((string *)&offsets,&stack0xfffffffffffffe48,(bool)(local_1b9 & 1U),
             (bool)(local_1ba & 1),(bool)(local_1bb & 1),(bool)(local_1bc & 1),(bool)(local_1bd & 1)
             ,(bool)local_1be,(bool)local_1be,(bool)(local_1b9 & 1U),(bool)(local_1bd & 1));
  Formatter::operator()
            ((Formatter *)local_1a8,"$1$, // bitmap\n",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&offsets);
  std::__cxx11::string::~string((string *)&offsets);
  if ((local_1b9 & 1U) != 0) {
    Formatter::operator()<>
              ((Formatter *)local_1a8,"PROTOBUF_FIELD_OFFSET($classtype$, $has_bits$),\n");
  }
  if ((local_1ba & 1) != 0) {
    Formatter::operator()<>
              ((Formatter *)local_1a8,"PROTOBUF_FIELD_OFFSET($classtype$, $extensions$),\n");
  }
  if ((local_1bb & 1) != 0) {
    Formatter::operator()<>
              ((Formatter *)local_1a8,"PROTOBUF_FIELD_OFFSET($classtype$, $oneof_case$[0]),\n");
  }
  if ((local_1bc & 1) != 0) {
    Formatter::operator()<>
              ((Formatter *)local_1a8,"PROTOBUF_FIELD_OFFSET($classtype$, $weak_field_map$),\n");
  }
  if ((local_1bd & 1) != 0) {
    Formatter::operator()<>
              ((Formatter *)local_1a8,
               "PROTOBUF_FIELD_OFFSET($classtype$, $inlined_string_donated_array$),\n");
  }
  if ((local_1be & 1) != 0) {
    Formatter::operator()<>
              ((Formatter *)local_1a8,
               "PROTOBUF_FIELD_OFFSET($classtype$, $split$),\nsizeof($classtype$::Impl_::Split),\n")
    ;
  }
  iVar4 = make_bitmap.num_generated_indices._4_4_;
  iVar5 = Descriptor::field_count(this->descriptor_);
  iVar6 = Descriptor::real_oneof_decl_count(this->descriptor_);
  local_1e8 = (FieldRangeImpl<google::protobuf::Descriptor> *)(long)(iVar4 + iVar5 + iVar6);
  if ((local_1b9 & 1U) != 0) {
    Formatter::operator()
              ((Formatter *)local_1a8,"$1$, // hasbit index offset\n",(unsigned_long *)&local_1e8);
  }
  pFVar2 = local_1e8;
  if ((local_1bd & 1) != 0) {
    sVar7 = std::vector<int,_std::allocator<int>_>::size(&this->has_bit_indices_);
    entries = (long)&pFVar2->descriptor + sVar7;
    Formatter::operator()((Formatter *)local_1a8,"$1$, // inline string index offset\n",&entries);
  }
  pFVar2 = local_1e8;
  __range3 = local_1e8;
  __begin3.descriptor =
       (Descriptor *)protobuf::internal::FieldRange<google::protobuf::Descriptor>(this->descriptor_)
  ;
  IVar13 = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::begin
                     ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
  __begin3._0_8_ = IVar13.descriptor;
  __end3.descriptor._0_4_ = IVar13.idx;
  IVar13 = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::end
                     ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
  __end3._0_8_ = IVar13.descriptor;
  field._0_4_ = IVar13.idx;
  while (bVar3 = protobuf::internal::operator!=((Iterator *)&__end3.descriptor,(Iterator *)&field),
        bVar3) {
    local_230 = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::
                operator*((Iterator *)&__end3.descriptor);
    this_00 = FieldDescriptor::options(local_230);
    bVar3 = FieldOptions::weak(this_00);
    if ((bVar3) ||
       (pOVar8 = FieldDescriptor::real_containing_oneof(local_230), pOVar8 != (OneofDescriptor *)0x0
       )) {
      Formatter::operator()<>((Formatter *)local_1a8,"::_pbi::kInvalidFieldOffsetTag");
    }
    else {
      bVar3 = ShouldSplit(local_230,&this->options_);
      pcVar9 = "::Impl_::Split";
      local_238 = "";
      if (bVar3) {
        local_238 = "::Impl_::Split";
      }
      local_2a9 = 0;
      bVar3 = ShouldSplit(local_230,&this->options_);
      if (bVar3) {
        FieldName_abi_cxx11_(&local_2a8,(cpp *)local_230,field_00);
        local_2a9 = 1;
        absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_288,&local_2a8);
        absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)local_2e0,"_");
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_258,(lts_20250127 *)&local_288,(AlphaNum *)local_2e0,(AlphaNum *)pcVar9);
      }
      else {
        FieldMemberName_abi_cxx11_
                  (&local_258,(cpp *)local_230,(FieldDescriptor *)0x0,SUB81(pcVar9,0));
      }
      Formatter::operator()
                ((Formatter *)local_1a8,"PROTOBUF_FIELD_OFFSET($classtype$$1$, $2$)",&local_238,
                 &local_258);
      std::__cxx11::string::~string((string *)&local_258);
      if ((local_2a9 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_2a8);
      }
    }
    bVar3 = ShouldSplit(local_230,&this->options_);
    if (bVar3) {
      Formatter::operator()<>((Formatter *)local_1a8," | ::_pbi::kSplitFieldOffsetMask");
    }
    bVar3 = IsEagerlyVerifiedLazy(local_230,&this->options_,this->scc_analyzer_);
    if (bVar3) {
      Formatter::operator()<>((Formatter *)local_1a8," | ::_pbi::kLazyMask");
    }
    else {
      bVar3 = IsStringInlined(local_230,&this->options_);
      if (bVar3) {
        Formatter::operator()<>((Formatter *)local_1a8," | ::_pbi::kInlinedMask");
      }
    }
    Formatter::operator()<>((Formatter *)local_1a8,",\n");
    protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator++
              ((Iterator *)&__end3.descriptor);
  }
  __range3_1._4_4_ = 0;
  __begin3_1.descriptor = (Descriptor *)OneOfRange(this->descriptor_);
  IVar14 = OneOfRangeImpl::begin((OneOfRangeImpl *)&__begin3_1.descriptor);
  __begin3_1._0_8_ = IVar14.descriptor;
  __end3_1.descriptor._0_4_ = IVar14.idx;
  IVar14 = OneOfRangeImpl::end((OneOfRangeImpl *)&__begin3_1.descriptor);
  __end3_1._0_8_ = IVar14.descriptor;
  oneof._0_4_ = IVar14.idx;
  while (bVar3 = cpp::operator!=((Iterator *)&__end3_1.descriptor,(Iterator *)&oneof), bVar3) {
    local_320 = OneOfRangeImpl::Iterator::operator*((Iterator *)&__end3_1.descriptor);
    sVar15 = OneofDescriptor::name(local_320);
    local_328 = sVar15._M_str;
    absl_log_internal_check_op_result = (Nullable<const_char_*>)sVar15._M_len;
    Formatter::operator()
              ((Formatter *)local_1a8,"PROTOBUF_FIELD_OFFSET($classtype$, _impl_.$1$_),\n",
               (basic_string_view<char,_std::char_traits<char>_> *)
               &absl_log_internal_check_op_result);
    __range3_1._4_4_ = __range3_1._4_4_ + 1;
    OneOfRangeImpl::Iterator::operator++((Iterator *)&__end3_1.descriptor);
  }
  iVar4 = absl::lts_20250127::log_internal::GetReferenceableValue(__range3_1._4_4_);
  iVar5 = Descriptor::real_oneof_decl_count(this->descriptor_);
  iVar5 = absl::lts_20250127::log_internal::GetReferenceableValue(iVar5);
  local_338 = absl::lts_20250127::log_internal::Check_EQImpl
                        (iVar4,iVar5,"count == descriptor_->real_oneof_decl_count()");
  if (local_338 != (Nullable<const_char_*>)0x0) {
    pcVar9 = absl::lts_20250127::implicit_cast<char_const*>(local_338);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&i,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
               ,0xa86,pcVar9);
    pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&i);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_339,pLVar10);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&i);
  }
  bVar3 = IsMapEntryMessage(this->descriptor_);
  if (bVar3) {
    __range3 = (FieldRangeImpl<google::protobuf::Descriptor> *)((long)&pFVar2->descriptor + 2);
    Formatter::operator()<>((Formatter *)local_1a8,"0,\n1,\n");
  }
  else {
    bVar3 = std::vector<int,_std::allocator<int>_>::empty(&this->has_bit_indices_);
    if (!bVar3) {
      sVar7 = std::vector<int,_std::allocator<int>_>::size(&this->has_bit_indices_);
      __range3 = (FieldRangeImpl<google::protobuf::Descriptor> *)((long)&pFVar2->descriptor + sVar7)
      ;
      for (index.field_2._8_8_ = 0; uVar1 = index.field_2._8_8_,
          sVar7 = std::vector<int,_std::allocator<int>_>::size(&this->has_bit_indices_),
          (ulong)uVar1 < sVar7; index.field_2._8_8_ = index.field_2._8_8_ + 1) {
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            (&this->has_bit_indices_,index.field_2._8_8_);
        __range4._6_1_ = 0;
        if (*pvVar11 < 0) {
          std::allocator<char>::allocator();
          __range4._6_1_ = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_378,"~0u",(allocator<char> *)((long)&__range4 + 7));
        }
        else {
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&this->has_bit_indices_,index.field_2._8_8_);
          absl::lts_20250127::AlphaNum::AlphaNum(&local_3a8,*pvVar11);
          absl::lts_20250127::StrCat_abi_cxx11_((string *)local_378,(lts_20250127 *)&local_3a8,a);
        }
        if ((__range4._6_1_ & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 7));
        }
        Formatter::operator()
                  ((Formatter *)local_1a8,"$1$,\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378);
        std::__cxx11::string::~string((string *)local_378);
      }
    }
  }
  bVar3 = std::vector<int,_std::allocator<int>_>::empty(&this->inlined_string_indices_);
  if (!bVar3) {
    sVar7 = std::vector<int,_std::allocator<int>_>::size(&this->inlined_string_indices_);
    __range3 = (FieldRangeImpl<google::protobuf::Descriptor> *)((long)&__range3->descriptor + sVar7)
    ;
    b = (AlphaNum *)__range3;
    __end4 = std::vector<int,_std::allocator<int>_>::begin(&this->inlined_string_indices_);
    iStack_3c8 = std::vector<int,_std::allocator<int>_>::end(&this->inlined_string_indices_);
    while (bVar3 = __gnu_cxx::operator!=(&__end4,&stack0xfffffffffffffc38), bVar3) {
      piVar12 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&__end4);
      index_1.field_2._12_4_ = *piVar12;
      if ((int)index_1.field_2._12_4_ < 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_3f0,"~0u,",&local_451);
        std::allocator<char>::~allocator(&local_451);
      }
      else {
        absl::lts_20250127::AlphaNum::AlphaNum(&local_420,index_1.field_2._12_4_);
        absl::lts_20250127::AlphaNum::AlphaNum(&local_450,",  // inlined_string_index");
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)local_3f0,(lts_20250127 *)&local_420,&local_450,b);
      }
      Formatter::operator()
                ((Formatter *)local_1a8,"$1$\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f0);
      std::__cxx11::string::~string((string *)local_3f0);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end4);
    }
  }
  Formatter::~Formatter((Formatter *)local_1a8);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_158);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_30);
  return (size_t)__range3;
}

Assistant:

size_t MessageGenerator::GenerateOffsets(io::Printer* p) {
  auto v = p->WithVars(ClassVars(descriptor_, options_));
  auto t = p->WithVars(MakeTrackerCalls(descriptor_, options_));
  Formatter format(p);

  int num_generated_indices = 1;
  const auto make_bitmap = [&](auto... bits) {
    uint32_t res = 0;
    int index = 0;
    ((res |= (static_cast<uint32_t>(bits) << index++)), ...);
    ((num_generated_indices += bits), ...);
    return absl::StrCat("0x", absl::Hex(res, absl::kZeroPad3));
  };

  const bool has_has_bits =
      !has_bit_indices_.empty() || IsMapEntryMessage(descriptor_);
  const bool has_extensions = descriptor_->extension_range_count() > 0;
  const bool has_oneofs = descriptor_->real_oneof_decl_count() > 0;
  const bool has_weak_fields = num_weak_fields_ > 0;
  const bool has_inline_strings = !inlined_string_indices_.empty();
  const bool has_split = ShouldSplit(descriptor_, options_);

  format("$1$, // bitmap\n",
         // These conditions have to match exactly the order done below
         make_bitmap(has_has_bits, has_extensions, has_oneofs, has_weak_fields,
                     has_inline_strings, has_split, has_split, has_has_bits,
                     has_inline_strings));

  // The order of these offsets has to match the reading of them in
  // MigrationToReflectionSchema.
  if (has_has_bits) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $has_bits$),\n");
  }
  if (has_extensions) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $extensions$),\n");
  }
  if (has_oneofs) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $oneof_case$[0]),\n");
  }
  if (has_weak_fields) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $weak_field_map$),\n");
  }
  if (has_inline_strings) {
    format(
        "PROTOBUF_FIELD_OFFSET($classtype$, "
        "$inlined_string_donated_array$),\n");
  }
  if (has_split) {
    format(
        "PROTOBUF_FIELD_OFFSET($classtype$, $split$),\n"
        "sizeof($classtype$::Impl_::Split),\n");
  }
  const size_t offsets = num_generated_indices + descriptor_->field_count() +
                         descriptor_->real_oneof_decl_count();
  if (has_has_bits) {
    format("$1$, // hasbit index offset\n", offsets);
  }
  if (has_inline_strings) {
    format("$1$, // inline string index offset\n",
           offsets + has_bit_indices_.size());
  }
  size_t entries = offsets;
  for (auto field : FieldRange(descriptor_)) {
    // TODO: We should not have an entry in the offset table for fields
    // that do not use them.
    if (field->options().weak() || field->real_containing_oneof()) {
      // Mark the field to prevent unintentional access through reflection.
      // Don't use the top bit because that is for unused fields.
      format("::_pbi::kInvalidFieldOffsetTag");
    } else {
      format("PROTOBUF_FIELD_OFFSET($classtype$$1$, $2$)",
             ShouldSplit(field, options_) ? "::Impl_::Split" : "",
             ShouldSplit(field, options_)
                 ? absl::StrCat(FieldName(field), "_")
                 : FieldMemberName(field, /*split=*/false));
    }

    // Some information about a field is in the pdproto profile. The profile is
    // only available at compile time. So we embed such information in the
    // offset of the field, so that the information is available when
    // reflectively accessing the field at run time.
    //
    // We embed whether the field is cold to the MSB of the offset, and whether
    // the field is eagerly verified lazy or inlined string to the LSB of the
    // offset.

    if (ShouldSplit(field, options_)) {
      format(" | ::_pbi::kSplitFieldOffsetMask");
    }
    if (IsEagerlyVerifiedLazy(field, options_, scc_analyzer_)) {
      format(" | ::_pbi::kLazyMask");
    } else if (IsStringInlined(field, options_)) {
      format(" | ::_pbi::kInlinedMask");
    }
    format(",\n");
  }

  int count = 0;
  for (auto oneof : OneOfRange(descriptor_)) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, _impl_.$1$_),\n", oneof->name());
    count++;
  }
  ABSL_CHECK_EQ(count, descriptor_->real_oneof_decl_count());

  if (IsMapEntryMessage(descriptor_)) {
    entries += 2;
    format(
        "0,\n"
        "1,\n");
  } else if (!has_bit_indices_.empty()) {
    entries += has_bit_indices_.size();
    for (size_t i = 0; i < has_bit_indices_.size(); ++i) {
      const std::string index =
          has_bit_indices_[i] >= 0 ? absl::StrCat(has_bit_indices_[i]) : "~0u";
      format("$1$,\n", index);
    }
  }
  if (!inlined_string_indices_.empty()) {
    entries += inlined_string_indices_.size();
    for (int inlined_string_index : inlined_string_indices_) {
      const std::string index =
          inlined_string_index >= 0
              ? absl::StrCat(inlined_string_index, ",  // inlined_string_index")
              : "~0u,";
      format("$1$\n", index);
    }
  }

  return entries;
}